

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

var __thiscall cs::runtime_type::parse_choice(runtime_type *this,var *a,iterator *b)

{
  char *__s1;
  int iVar1;
  undefined *puVar2;
  bool *pbVar3;
  runtime_error *this_00;
  iterator *in_RCX;
  string local_40;
  
  if (b->mData == (tree_node *)0x0) {
    puVar2 = &void::typeinfo;
  }
  else {
    puVar2 = (undefined *)(*(code *)b->mData->right->root->right)();
  }
  __s1 = *(char **)(puVar2 + 8);
  if (__s1 != std::ios_base::out) {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,std::ios_base::out);
      if (iVar1 == 0) goto LAB_00136d7a;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unsupported operator operations(Choice).","");
    runtime_error::runtime_error(this_00,&local_40);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
LAB_00136d7a:
  pbVar3 = cs_impl::any::const_val<bool>((any *)b);
  if (*pbVar3 == true) {
    local_40._M_dataplus._M_p = (pointer)tree_type<cs::token_base_*>::iterator::left(in_RCX);
  }
  else {
    local_40._M_dataplus._M_p = (pointer)tree_type<cs::token_base_*>::iterator::right(in_RCX);
  }
  parse_expr(this,(iterator *)a,SUB81(&local_40,0));
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_choice(const var &a, const tree_type<token_base *>::iterator &b)
	{
		if (a.type() == typeid(boolean)) {
			if (a.const_val<boolean>())
				return parse_expr(b.left());
			else
				return parse_expr(b.right());
		}
		else
			throw runtime_error("Unsupported operator operations(Choice).");
	}